

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

void __thiscall sznet::CountDownLatch::CountDownLatch(CountDownLatch *this,int count)

{
  int count_local;
  CountDownLatch *this_local;
  
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_condition,&this->m_mutex);
  this->m_count = count;
  return;
}

Assistant:

CountDownLatch::CountDownLatch(int count) :
	m_mutex(),
	m_condition(m_mutex),
	m_count(count)
{
}